

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O3

void getnameinfo_cb(uv_getnameinfo_t *handle,int status,char *hostname,char *service)

{
  int iVar1;
  uv_loop_t *puVar2;
  long lVar3;
  ulong *extraout_RDX;
  ulong *puVar4;
  long lVar5;
  int64_t eval_b;
  int64_t eval_a;
  uv_timer_t uStack_998;
  uv_work_t auStack_920 [16];
  undefined8 uStack_120;
  uv_loop_t *puStack_118;
  ulong uStack_d8;
  ulong uStack_d0;
  uv_random_t uStack_c8;
  undefined1 auStack_38 [8];
  
  if (status == -0xbbb) {
    if (hostname != (char *)0x0) goto LAB_001d075e;
    if (service == (char *)0x0) {
      return;
    }
  }
  else {
    getnameinfo_cb_cold_1();
LAB_001d075e:
    getnameinfo_cb_cold_2();
  }
  getnameinfo_cb_cold_3();
  saturate_threadpool();
  puVar2 = uv_default_loop();
  lVar3 = 1;
  iVar1 = uv_random(puVar2,&uStack_c8,auStack_38,1,0,nop_random_cb);
  uStack_d0 = (ulong)iVar1;
  uStack_d8 = 0;
  if (uStack_d0 == 0) {
    iVar1 = uv_cancel((uv_req_t *)&uStack_c8);
    uStack_d0 = (ulong)iVar1;
    uStack_d8 = 0;
    if (uStack_d0 != 0) goto LAB_001d08e9;
    uStack_d0 = (ulong)done_cb_called;
    uStack_d8 = 0;
    if (uStack_d0 != 0) goto LAB_001d08f8;
    lVar5 = 0;
    uStack_d0 = 0;
    do {
      uv_sem_post((uv_sem_t *)((long)pause_sems + lVar5));
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0x80);
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    uStack_d0 = (ulong)iVar1;
    uStack_d8 = 0;
    if (uStack_d0 != 0) goto LAB_001d0907;
    uStack_d0 = 1;
    uStack_d8 = (ulong)done_cb_called;
    if (uStack_d8 != 1) goto LAB_001d0916;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    uStack_d0 = 0;
    iVar1 = uv_loop_close(puVar2);
    uStack_d8 = (ulong)iVar1;
    if (uStack_d0 == uStack_d8) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_threadpool_cancel_random_cold_1();
LAB_001d08e9:
    run_test_threadpool_cancel_random_cold_2();
LAB_001d08f8:
    run_test_threadpool_cancel_random_cold_3();
LAB_001d0907:
    run_test_threadpool_cancel_random_cold_4();
LAB_001d0916:
    run_test_threadpool_cancel_random_cold_5();
  }
  puVar4 = &uStack_d0;
  iVar1 = (int)&uStack_d8;
  run_test_threadpool_cancel_random_cold_6();
  if (iVar1 != -0x7d) {
    nop_random_cb_cold_1();
LAB_001d0997:
    puStack_118 = (uv_loop_t *)0x209fd5;
    uStack_120 = 0x1d09d7;
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
            ,0xc1,"buf");
    abort();
  }
  if (puVar4 + 0x12 != extraout_RDX) goto LAB_001d0997;
  if (lVar3 == 1) {
    done_cb_called = done_cb_called + 1;
    return;
  }
  nop_random_cb_cold_2();
  puStack_118 = puVar2;
  puVar2 = uv_default_loop();
  saturate_threadpool();
  lVar3 = 0;
  do {
    iVar1 = uv_queue_work(puVar2,(uv_work_t *)((long)auStack_920[0].reserved + lVar3 + -0x18),
                          work2_cb,done2_cb);
    if (iVar1 != 0) {
      run_test_threadpool_cancel_work_cold_1();
      goto LAB_001d0bb7;
    }
    lVar3 = lVar3 + 0x80;
  } while (lVar3 != 0x800);
  iVar1 = uv_timer_init(puVar2,&uStack_998);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&uStack_998,timer_cb,10,0);
    if (iVar1 != 0) goto LAB_001d0bc6;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001d0bd5;
    if (timer_cb_called != 1) goto LAB_001d0be4;
    if (done2_cb_called == 0x10) {
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001d0c02;
    }
  }
  else {
LAB_001d0bb7:
    run_test_threadpool_cancel_work_cold_2();
LAB_001d0bc6:
    run_test_threadpool_cancel_work_cold_3();
LAB_001d0bd5:
    run_test_threadpool_cancel_work_cold_4();
LAB_001d0be4:
    run_test_threadpool_cancel_work_cold_5();
  }
  run_test_threadpool_cancel_work_cold_6();
LAB_001d0c02:
  run_test_threadpool_cancel_work_cold_7();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-threadpool-cancel.c"
          ,0x99,"0 && \"work2_cb called\"");
  abort();
}

Assistant:

static void getnameinfo_cb(uv_getnameinfo_t* handle,
                           int status,
                           const char* hostname,
                           const char* service) {
  ASSERT_EQ(status, UV_EAI_CANCELED);
  ASSERT_NULL(hostname);
  ASSERT_NULL(service);
}